

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialog::showEvent(QDialog *this,QShowEvent *event)

{
  bool bVar1;
  QFlagsStorage<Qt::WindowState> newstate;
  QFlagsStorageHelper<Qt::WindowState,_4> QVar2;
  
  if (event[0xb] == (QShowEvent)0x0) {
    bVar1 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Moved);
    if (!bVar1) {
      newstate.i = (Int)QWidget::windowState(&this->super_QWidget);
      adjustPosition(this,*(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
      QWidget::setAttribute(&this->super_QWidget,WA_Moved,false);
      QVar2.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)QWidget::windowState(&this->super_QWidget);
      if ((QFlagsStorage<Qt::WindowState>)newstate.i != QVar2.super_QFlagsStorage<Qt::WindowState>.i
         ) {
        QWidget::setWindowState(&this->super_QWidget,(WindowStates)newstate.i);
        return;
      }
    }
  }
  return;
}

Assistant:

void QDialog::showEvent(QShowEvent *event)
{
    if (!event->spontaneous() && !testAttribute(Qt::WA_Moved)) {
        Qt::WindowStates  state = windowState();
        adjustPosition(parentWidget());
        setAttribute(Qt::WA_Moved, false); // not really an explicit position
        if (state != windowState())
            setWindowState(state);
    }
}